

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmul(fitsfile *mfptr,int rmopt,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  int in_ESI;
  fitsfile *in_RDI;
  bool bVar3;
  fitsfile *gfptr;
  char card [81];
  char keyword [75];
  char memberExtname [71];
  char memberHDUtype [71];
  char mbrLocation2 [1025];
  char mbrLocation1 [1025];
  long memberID;
  long memberExtver;
  long ngroups;
  long index;
  int iomode;
  int memberPosition;
  int *in_stack_00000ea0;
  char *in_stack_00000ea8;
  char *in_stack_00000eb0;
  char *in_stack_00000eb8;
  char *in_stack_00000ec0;
  fitsfile *in_stack_00000ec8;
  int *in_stack_00000ee0;
  char *in_stack_00001b58;
  int in_stack_00001b60;
  int in_stack_00001b64;
  char *in_stack_00001b68;
  char *in_stack_00001b70;
  fitsfile *in_stack_00001b78;
  long *in_stack_00001b90;
  int *in_stack_00001b98;
  char *in_stack_fffffffffffff630;
  char local_9b8 [32];
  int *in_stack_fffffffffffff668;
  char *in_stack_fffffffffffff670;
  long *in_stack_fffffffffffff678;
  char *in_stack_fffffffffffff680;
  fitsfile *in_stack_fffffffffffff688;
  char local_958 [24];
  int *in_stack_fffffffffffff6c0;
  LONGLONG in_stack_fffffffffffff6c8;
  LONGLONG in_stack_fffffffffffff6d0;
  fitsfile *in_stack_fffffffffffff6d8;
  char local_8b8 [80];
  char local_868 [32];
  int *in_stack_fffffffffffff7b8;
  long *in_stack_fffffffffffff7c0;
  fitsfile *in_stack_fffffffffffff7c8;
  int *in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  fitsfile *in_stack_fffffffffffff7e8;
  char local_458 [1040];
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  ulong local_30;
  int local_28 [2];
  int *local_20;
  int local_14;
  fitsfile *local_10;
  int local_4;
  
  local_28[1] = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  if (*in_RDX == 0) {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = ffgkys(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                   (char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                   in_stack_fffffffffffff668);
    *local_20 = iVar1;
    if (*local_20 == 0xca) {
      strcpy(local_8b8,"PRIMARY");
      *local_20 = 0;
    }
    prepare_keyvalue(in_stack_fffffffffffff630);
    iVar1 = ffgkyj(in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    *local_20 = iVar1;
    if (*local_20 == 0xca) {
      local_40 = 1;
      *local_20 = 0;
    }
    iVar1 = ffgkys(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                   (char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                   in_stack_fffffffffffff668);
    *local_20 = iVar1;
    if (*local_20 == 0xca) {
      *local_20 = 0;
    }
    prepare_keyvalue(in_stack_fffffffffffff630);
    ffghdn(local_10,local_28 + 1);
    iVar1 = fits_get_url(in_stack_00000ec8,in_stack_00000ec0,in_stack_00000eb8,in_stack_00000eb0,
                         in_stack_00000ea8,in_stack_00000ea0,in_stack_00000ee0);
    *local_20 = iVar1;
    if (*local_20 == 0) {
      iVar1 = ffgmng(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
      *local_20 = iVar1;
      local_30 = 1;
      while( true ) {
        bVar3 = false;
        if ((long)local_30 <= local_38) {
          bVar3 = *local_20 == 0;
        }
        if (!bVar3) break;
        iVar1 = ffgtop((fitsfile *)mbrLocation1._472_8_,mbrLocation1._468_4_,
                       (fitsfile **)mbrLocation1._456_8_,(int *)mbrLocation1._448_8_);
        *local_20 = iVar1;
        if (*local_20 == 0) {
          ffflmd((fitsfile *)0x0,local_28,local_20);
          if (local_28[0] == 1) {
            local_48 = 0;
            sVar2 = strlen(local_458);
            if (sVar2 != 0) {
              iVar1 = ffgmf(in_stack_00001b78,in_stack_00001b70,in_stack_00001b68,in_stack_00001b64,
                            in_stack_00001b60,in_stack_00001b58,in_stack_00001b90,in_stack_00001b98)
              ;
              *local_20 = iVar1;
            }
            if ((*local_20 == 0x156) && (sVar2 = strlen(local_868), sVar2 != 0)) {
              *local_20 = 0;
              iVar1 = ffgmf(in_stack_00001b78,in_stack_00001b70,in_stack_00001b68,in_stack_00001b64,
                            in_stack_00001b60,in_stack_00001b58,in_stack_00001b90,in_stack_00001b98)
              ;
              *local_20 = iVar1;
            }
            if (*local_20 == 0) {
              iVar1 = ffdrow(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                             in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
              *local_20 = iVar1;
            }
            if (*local_20 == 0x156) {
              ffpmsg((char *)0x1d8550);
            }
            *local_20 = 0;
          }
          else {
            snprintf(local_9b8,0x51,"The %dth group cannot be modified (ffgtam)",
                     local_30 & 0xffffffff);
            ffpmsg((char *)0x1d83f5);
          }
        }
        else {
          *local_20 = 0;
          snprintf(local_9b8,0x51,"Cannot open the %dth group table (ffgmul)",local_30 & 0xffffffff)
          ;
          ffpmsg((char *)0x1d83a0);
        }
        local_30 = local_30 + 1;
      }
      if ((*local_20 == 0) && (local_14 != 0)) {
        ffflmd(local_10,local_28,local_20);
        if (local_28[0] == 0) {
          ffpmsg((char *)0x1d85ef);
        }
        else {
          local_30 = 1;
          while( true ) {
            bVar3 = false;
            if ((long)local_30 <= local_38) {
              bVar3 = *local_20 == 0;
            }
            if (!bVar3) break;
            snprintf(local_958,0x4b,"GRPID%d",local_30 & 0xffffffff);
            ffdkey(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
            snprintf(local_958,0x4b,"GRPLC%d",local_30 & 0xffffffff);
            ffdkey(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
            if (*local_20 == 0xca) {
              *local_20 = 0;
            }
            local_30 = local_30 + 1;
          }
        }
      }
    }
    local_4 = *local_20;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgmul(fitsfile *mfptr,   /* pointer to the grouping table member HDU    */
           int       rmopt,   /* 0 ==> leave GRPIDn/GRPLCn keywords,
				 1 ==> remove GRPIDn/GRPLCn keywords         */
	   int      *status) /* return status code                          */

/*
   examine all the GRPIDn and GRPLCn keywords in the member HDUs header
   and remove the member from the grouping tables referenced; This
   effectively "unlinks" the member from all of its groups. The rmopt 
   specifies if the GRPIDn/GRPLCn keywords are to be removed from the
   member HDUs header after the unlinking.
*/

{
  int memberPosition = 0;
  int iomode;

  long index;
  long ngroups      = 0;
  long memberExtver = 0;
  long memberID     = 0;

  char mbrLocation1[FLEN_FILENAME];
  char mbrLocation2[FLEN_FILENAME];
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  fitsfile *gfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 determine location parameters of the member HDU; note that
	 default values are supplied if the expected keywords are not
	 found
      */

      *status = fits_read_key_str(mfptr,"XTENSION",memberHDUtype,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(mfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(mfptr,"EXTNAME",memberExtname,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(mfptr,&memberPosition);

      *status = fits_get_url(mfptr,mbrLocation1,mbrLocation2,NULL,NULL,
			     NULL,status);

      if(*status != 0) continue;

      /*
	 open each grouping table linked to this HDU and remove the member 
	 from the grouping tables
      */

      *status = fits_get_num_groups(mfptr,&ngroups,status);

      /* loop over each group linked to the member HDU */

      for(index = 1; index <= ngroups && *status == 0; ++index)
	{
	  /* open the (index)th group linked to the member HDU */ 

	  *status = fits_open_group(mfptr,index,&gfptr,status);

	  /* if the group could not be opened then just skip it */

	  if(*status != 0)
	    {
	      *status = 0;
	      snprintf(card,FLEN_CARD,"Cannot open the %dth group table (ffgmul)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /*
	    make sure the grouping table can be modified before proceeding
	  */
	  
	  fits_file_mode(gfptr,&iomode,status);

	  if(iomode != READWRITE)
	    {
	      snprintf(card,FLEN_CARD,"The %dth group cannot be modified (ffgtam)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /* 
	     try to find the member's row within the grouping table; first 
	     try using the member HDU file's "real" URL string then try
	     using its originally opened URL string if either string exist
	   */
	     
	  memberID = 0;
 
	  if(strlen(mbrLocation1) != 0)
	    {
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation1,&memberID,status);
	    }

	  if(*status == MEMBER_NOT_FOUND && strlen(mbrLocation2) != 0)
	    {
	      *status = 0;
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation2,&memberID,status);
	    }

	  /* if the member was found then delete it from the grouping table */

	  if(*status == 0)
	    *status = fits_delete_rows(gfptr,memberID,1,status);

	  /*
	     continue the loop over all member groups even if an error
	     was generated
	  */

	  if(*status == MEMBER_NOT_FOUND)
	    {
	      ffpmsg("cannot locate member's entry in group table (ffgmul)");
	    }
	  *status = 0;

	  /*
	     close the file pointed to by gfptr if it is non NULL to
	     prepare for the next loop iterration
	  */

	  if(gfptr != NULL)
	    {
	      fits_close_file(gfptr,status);
	      gfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      /*
	 if rmopt is non-zero then find and delete the GRPIDn/GRPLCn 
	 keywords from the member HDU header
      */

      if(rmopt != 0)
	{
	  fits_file_mode(mfptr,&iomode,status);

	  if(iomode == READONLY)
	    {
	      ffpmsg("Cannot modify member HDU, opened READONLY (ffgmul)");
	      continue;
	    }

	  /* delete all the GRPIDn/GRPLCn keywords */

	  for(index = 1; index <= ngroups && *status == 0; ++index)
	    {
	      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }while(0);

  /* make sure the gfptr has been closed */

  if(gfptr != NULL)
    { 
      fits_close_file(gfptr,status);
    }

return(*status);
}